

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  Drop *pDVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pDVar1 = wasm::Builder::makeDrop(&local_10,value);
  return (BinaryenExpressionRef)pDVar1;
}

Assistant:

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,
                                   BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeDrop((Expression*)value);
  return static_cast<Expression*>(ret);
}